

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_28c605::ArgParser::argEncUserPassword(ArgParser *this,string *arg)

{
  bool bVar1;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *arg_local;
  ArgParser *this_local;
  
  local_18 = arg;
  arg_local = (string *)this;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->accumulated_args);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"positional and dashed encryption arguments may not be mixed",
               &local_39);
    usage(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  this->used_enc_password_args = true;
  std::__cxx11::string::operator=((string *)&this->user_password,(string *)local_18);
  return;
}

Assistant:

void
ArgParser::argEncUserPassword(std::string const& arg)
{
    if (!accumulated_args.empty()) {
        usage("positional and dashed encryption arguments may not be mixed");
    }
    this->used_enc_password_args = true;
    this->user_password = arg;
}